

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void LinkedList_AddEntry(LinkedList **start,void *toAdd,FAudioMutex lock,FAudioMallocFunc pMalloc)

{
  undefined8 *puVar1;
  code *in_RCX;
  undefined8 in_RSI;
  long *in_RDI;
  LinkedList *latest;
  LinkedList *newEntry;
  long local_30;
  
  puVar1 = (undefined8 *)(*in_RCX)(0x10);
  *puVar1 = in_RSI;
  puVar1[1] = 0;
  FAudio_PlatformLockMutex((FAudioMutex)0x12e1ba);
  if (*in_RDI == 0) {
    *in_RDI = (long)puVar1;
  }
  else {
    for (local_30 = *in_RDI; *(long *)(local_30 + 8) != 0; local_30 = *(long *)(local_30 + 8)) {
    }
    *(undefined8 **)(local_30 + 8) = puVar1;
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x12e215);
  return;
}

Assistant:

void LinkedList_AddEntry(
	LinkedList **start,
	void* toAdd,
	FAudioMutex lock,
	FAudioMallocFunc pMalloc
) {
	LinkedList *newEntry, *latest;
	newEntry = (LinkedList*) pMalloc(sizeof(LinkedList));
	newEntry->entry = toAdd;
	newEntry->next = NULL;
	FAudio_PlatformLockMutex(lock);
	if (*start == NULL)
	{
		*start = newEntry;
	}
	else
	{
		latest = *start;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = newEntry;
	}
	FAudio_PlatformUnlockMutex(lock);
}